

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurveyor.c
# Opt level: O0

void nn_xsurveyor_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_dist *self_00;
  nn_pipe *in_RSI;
  nn_dist_data *in_RDI;
  nn_xsurveyor_data *data;
  nn_xsurveyor *xsurveyor;
  
  if (in_RDI == (nn_dist_data *)0x0) {
    in_RDI = (nn_dist_data *)0x0;
  }
  self_00 = (nn_dist *)nn_pipe_getdata(in_RSI);
  nn_fq_rm((nn_fq *)self_00,(nn_fq_data *)in_RDI);
  nn_dist_rm(self_00,in_RDI);
  nn_free((void *)0x15de49);
  return;
}

Assistant:

void nn_xsurveyor_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xsurveyor *xsurveyor;
    struct nn_xsurveyor_data *data;

    xsurveyor = nn_cont (self, struct nn_xsurveyor, sockbase);
    data = nn_pipe_getdata (pipe);

    nn_fq_rm (&xsurveyor->inpipes, &data->initem);
    nn_dist_rm (&xsurveyor->outpipes, &data->outitem);

    nn_free (data);
}